

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
::
emplace<std::type_index,ska::flat_hash_map<std::type_index,std::any,slang::Hasher<std::type_index>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index,std::any>>>::convertible_to_value>
          (sherwood_v3_table<std::pair<std::type_index,std::any>,std::type_index,slang::Hasher<std::type_index>,ska::detailv3::KeyOrValueHasher<std::type_index,std::pair<std::type_index,std::any>,slang::Hasher<std::type_index>>,std::equal_to<std::type_index>,ska::detailv3::KeyOrValueEquality<std::type_index,std::pair<std::type_index,std::any>,std::equal_to<std::type_index>>,std::allocator<std::pair<std::type_index,std::any>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,std::any>>>>
           *this,type_index *key,convertible_to_value *args)

{
  bool bVar1;
  size_t sVar2;
  EntryPointer current_entry;
  char distance_from_desired;
  pair<ska::detailv3::sherwood_v3_table<std::pair<std::type_index,_std::any>,_std::type_index,_slang::Hasher<std::type_index>,_ska::detailv3::KeyOrValueHasher<std::type_index,_std::pair<std::type_index,_std::any>,_slang::Hasher<std::type_index>_>,_std::equal_to<std::type_index>,_ska::detailv3::KeyOrValueEquality<std::type_index,_std::pair<std::type_index,_std::any>,_std::equal_to<std::type_index>_>,_std::allocator<std::pair<std::type_index,_std::any>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::type_index,_std::any>_>_>_>::templated_iterator<std::pair<std::type_index,_std::any>_>,_bool>
  pVar3;
  
  sVar2 = std::type_index::hash_code(key);
  current_entry =
       (EntryPointer)
       ((sVar2 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x20 + *(long *)this);
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar3 = emplace_new_key<std::type_index,ska::flat_hash_map<std::type_index,std::any,slang::Hasher<std::type_index>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index,std::any>>>::convertible_to_value>
                        (this,distance_from_desired,current_entry,key,args);
      return pVar3;
    }
    bVar1 = std::type_index::operator==(key,&(current_entry->field_1).value.first);
    if (bVar1) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar3._8_8_ = 0;
  pVar3.first.current = current_entry;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }